

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Array<double,_4> * __thiscall
tcu::Matrix<double,_2,_2>::getColumnMajorData(Matrix<double,_2,_2> *this)

{
  double dVar1;
  Array<double,_4> *a;
  Array<double,_4> *in_RDI;
  
  dVar1 = (this->m_data).m_data[0].m_data[1];
  in_RDI->m_data[0] = (this->m_data).m_data[0].m_data[0];
  in_RDI->m_data[1] = dVar1;
  dVar1 = (this->m_data).m_data[1].m_data[1];
  in_RDI->m_data[2] = (this->m_data).m_data[1].m_data[0];
  in_RDI->m_data[3] = dVar1;
  return in_RDI;
}

Assistant:

Array<T, Rows*Cols> Matrix<T, Rows, Cols>::getColumnMajorData (void) const
{
	Array<T, Rows*Cols> a;
	T* dst = a.getPtr();
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			*dst++ = (*this)(row, col);
	return a;
}